

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# border.cpp
# Opt level: O2

void __thiscall ftxui::anon_unknown_0::BorderPixel::SetBox(BorderPixel *this,Box box)

{
  element_type *peVar1;
  pointer psVar2;
  ulong uVar3;
  
  uVar3 = box._0_8_;
  Node::SetBox(&this->super_Node,box);
  psVar2 = (this->super_Node).children_.
           super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((long)(this->super_Node).children_.
            super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
            ._M_impl.super__Vector_impl_data._M_finish - (long)psVar2 == 0x20) {
    peVar1 = psVar2[1].super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar3 = uVar3 + 1 & 0xffffffff | (uVar3 & 0xffffffff00000000) - 0x100000000;
    (**(code **)((long)peVar1->_vptr_Node + 0x18))
              (peVar1,uVar3,(box._8_8_ & 0xffffffff) * 0x100000001);
    psVar2 = (this->super_Node).children_.
             super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  else {
    uVar3 = uVar3 + 1 & 0xffffffff | (uVar3 & 0xffffffff00000000) - 0x100000000;
  }
  peVar1 = (psVar2->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (**(code **)((long)peVar1->_vptr_Node + 0x18))
            (peVar1,uVar3,(ulong)(box.y_min + 1) | (box._8_8_ & 0xffffffff00000000) - 0x100000000);
  return;
}

Assistant:

void SetBox(Box box) override {
    Node::SetBox(box);
    if (children_.size() == 2) {
      Box title_box;
      title_box.x_min = box.x_min + 1;
      title_box.x_max = box.x_max - 1;
      title_box.y_min = box.y_min;
      title_box.y_max = box.y_min;
      children_[1]->SetBox(title_box);
    }
    box.x_min++;
    box.x_max--;
    box.y_min++;
    box.y_max--;
    children_[0]->SetBox(box);
  }